

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelMultiSorted.cpp
# Opt level: O0

void __thiscall
FMB::FiniteModelMultiSorted::eliminateSortFunctionsAndPredicates
          (FiniteModelMultiSorted *this,Stack<unsigned_int> *sortFunctions,
          Stack<unsigned_int> *sortPredicates)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  size_t sVar6;
  uint *puVar7;
  Term *pTVar8;
  DArray<int> *pDVar9;
  int *piVar10;
  char *pcVar11;
  int iVar12;
  Stack<unsigned_int> *in_RDX;
  void *__child_stack;
  void *__child_stack_00;
  Stack<unsigned_int> *in_RSI;
  DArray<unsigned_int> *in_RDI;
  void *in_R8;
  uint i_12;
  uint old_res_3;
  uint old_var_3;
  uint i_srt_3;
  uint i_13;
  uint i_11;
  DArray<unsigned_int> old_args_3;
  DArray<unsigned_int> args_3;
  uint arity_3;
  OperatorType *sig_3;
  Symbol *symb_3;
  uint p_1;
  uint i_9;
  uint res_3;
  uint res_srt_1;
  uint old_res_2;
  uint old_var_2;
  uint i_srt_2;
  uint i_10;
  uint i_8;
  DArray<unsigned_int> old_args_2;
  DArray<unsigned_int> args_2;
  uint arity_2;
  OperatorType *sig_2;
  Symbol *symb_2;
  uint f_1;
  uint var_2;
  DArray<unsigned_int> old_sizes_1;
  type old_p_interpretation_1;
  type old_p_offsets_1;
  type old_f_interpretation_1;
  type old_f_offsets_1;
  char res_2;
  uint j_1;
  uint var_3;
  uint newSize_1;
  uint origSize_1;
  DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> old_to_new_1;
  DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> new_to_old_1;
  uint srt_1;
  Symbol *elim_symb_1;
  uint elim_p;
  uint i_7;
  uint i_5;
  char old_res_1;
  uint old_var_1;
  uint i_srt_1;
  uint i_6;
  uint i_4;
  DArray<unsigned_int> old_args_1;
  DArray<unsigned_int> args_1;
  uint arity_1;
  OperatorType *sig_1;
  Symbol *symb_1;
  uint p;
  uint i_2;
  uint res_1;
  uint res_srt;
  uint old_res;
  uint old_var;
  uint i_srt;
  uint i_3;
  uint i_1;
  DArray<unsigned_int> old_args;
  DArray<unsigned_int> args;
  uint arity;
  OperatorType *sig;
  Symbol *symb;
  uint f;
  uint var;
  DArray<unsigned_int> old_sizes;
  type old_p_interpretation;
  type old_p_offsets;
  type old_f_interpretation;
  type old_f_offsets;
  uint res;
  uint j;
  uint var_1;
  uint newSize;
  uint origSize;
  DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> old_to_new;
  DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> new_to_old;
  DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> f_range;
  uint srt;
  Symbol *elim_symb;
  uint elim_f;
  uint i;
  uint in_stack_fffffffffffff72c;
  Signature *in_stack_fffffffffffff730;
  DArray<unsigned_int> *in_stack_fffffffffffff738;
  undefined4 in_stack_fffffffffffff740;
  uint in_stack_fffffffffffff744;
  Term *in_stack_fffffffffffff748;
  uint in_stack_fffffffffffff754;
  DArray<unsigned_int> *in_stack_fffffffffffff758;
  TermList in_stack_fffffffffffff760;
  DArray<unsigned_int> *in_stack_fffffffffffff768;
  FiniteModelMultiSorted *in_stack_fffffffffffff770;
  uint local_854;
  FiniteModelMultiSorted *in_stack_fffffffffffff7f0;
  uint local_77c;
  uint local_734;
  uint local_634;
  uint local_55c;
  uint local_504;
  uint local_464;
  uint local_448;
  uint local_444;
  DArray<unsigned_int> local_440;
  DArray<unsigned_int> local_428;
  uint local_40c;
  OperatorType *local_408;
  FiniteModelMultiSorted *local_400;
  uint local_3f4;
  uint64_t local_3f0;
  uint local_3e8;
  uint local_3e4;
  uint64_t local_3e0;
  uint local_3d4;
  uint local_3d0;
  uint local_3cc;
  uint64_t local_3c8;
  uint local_3bc;
  uint local_3b8;
  uint local_3b4;
  DArray<unsigned_int> local_3b0;
  DArray<unsigned_int> local_398;
  uint local_37c;
  OperatorType *local_378;
  Symbol *local_370;
  uint local_368;
  uint local_364;
  DArray<unsigned_int> local_360;
  DArray<char> local_348 [2];
  DArray<unsigned_int> local_318 [2];
  undefined4 local_2e8;
  char local_2e1;
  uint local_2e0;
  uint local_2dc;
  uint local_2d8;
  uint local_2d4;
  DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> local_2d0;
  DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> local_2a8;
  uint64_t local_280;
  uint local_274;
  Symbol *local_270;
  uint local_268;
  uint local_264;
  uint64_t local_260;
  uint local_254;
  char local_24d;
  uint local_24c;
  uint64_t local_248;
  uint local_23c;
  uint local_238;
  uint local_234;
  DArray<unsigned_int> local_230;
  DArray<unsigned_int> local_218;
  uint local_1fc;
  OperatorType *local_1f8;
  Symbol *local_1f0;
  uint local_1e4;
  uint64_t local_1e0;
  uint local_1d8;
  uint local_1d4;
  uint64_t local_1d0;
  uint local_1c4;
  uint local_1c0;
  uint local_1bc;
  uint64_t local_1b8;
  uint local_1ac;
  uint local_1a8;
  uint local_1a4;
  DArray<unsigned_int> local_1a0;
  DArray<unsigned_int> local_188;
  uint local_16c;
  OperatorType *local_168;
  Symbol *local_160;
  uint local_158;
  uint local_154;
  DArray<unsigned_int> local_150;
  DArray<char> local_138 [2];
  DArray<unsigned_int> local_108;
  DArray<unsigned_int> local_f0;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> local_c0;
  DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> local_88 [2];
  uint64_t local_38;
  uint local_2c;
  Symbol *local_28;
  uint local_20;
  uint local_1c;
  Stack<unsigned_int> *local_18;
  Stack<unsigned_int> *local_10;
  
  local_1c = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  do {
    uVar5 = (ulong)local_1c;
    sVar6 = Lib::Stack<unsigned_int>::size(local_10);
    if (sVar6 <= uVar5) {
      local_264 = 0;
      do {
        uVar5 = (ulong)local_264;
        sVar6 = Lib::Stack<unsigned_int>::size(local_18);
        if (sVar6 <= uVar5) {
          return;
        }
        puVar7 = Lib::Stack<unsigned_int>::operator[](local_18,(ulong)local_264);
        local_268 = *puVar7;
        local_270 = Kernel::Signature::getPredicate
                              (in_stack_fffffffffffff730,in_stack_fffffffffffff72c);
        Kernel::Signature::Symbol::predType
                  ((Symbol *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740));
        local_280 = (uint64_t)
                    Kernel::OperatorType::arg
                              ((OperatorType *)in_stack_fffffffffffff738,
                               (uint)((ulong)in_stack_fffffffffffff730 >> 0x20));
        pTVar8 = Kernel::TermList::term((TermList *)0x2d872e);
        local_274 = Kernel::Term::functor(pTVar8);
        Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::DHMap
                  (&local_2a8);
        Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::DHMap
                  (&local_2d0);
        puVar7 = Lib::DArray<unsigned_int>::operator[](in_RDI,(ulong)local_274);
        local_2d4 = *puVar7;
        local_2d8 = 0;
        puVar7 = Lib::DArray<unsigned_int>::operator[](in_RDI + 2,(ulong)local_268);
        local_2dc = *puVar7;
        for (local_2e0 = 1; iVar12 = (int)sVar6, local_2e0 <= local_2d4; local_2e0 = local_2e0 + 1)
        {
          uVar5 = (ulong)local_2dc;
          local_2dc = local_2dc + 1;
          pcVar11 = Lib::DArray<char>::operator[]((DArray<char> *)(in_RDI + 4),uVar5);
          local_2e1 = *pcVar11;
          if (local_2e1 == '\x02') {
            local_2d8 = local_2d8 + 1;
            Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                      ((DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                       CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                       (uint)((ulong)in_stack_fffffffffffff738 >> 0x20),
                       (uint)in_stack_fffffffffffff738);
            Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                      ((DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                       CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                       (uint)((ulong)in_stack_fffffffffffff738 >> 0x20),
                       (uint)in_stack_fffffffffffff738);
          }
        }
        if (local_2d4 == local_2d8) {
          local_2e8 = 0x26;
        }
        else {
          Lib::DArray<unsigned_int>::DArray
                    ((DArray<unsigned_int> *)
                     CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                     in_stack_fffffffffffff738);
          Lib::DArray<unsigned_int>::DArray
                    ((DArray<unsigned_int> *)
                     CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                     in_stack_fffffffffffff738);
          Lib::DArray<unsigned_int>::DArray
                    ((DArray<unsigned_int> *)
                     CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                     in_stack_fffffffffffff738);
          Lib::DArray<char>::DArray
                    ((DArray<char> *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                     (DArray<char> *)in_stack_fffffffffffff738);
          Lib::DArray<unsigned_int>::clone(&local_360,(__fn *)in_RDI,__child_stack_00,iVar12,in_R8);
          uVar4 = local_2d8;
          puVar7 = Lib::DArray<unsigned_int>::operator[](in_RDI,(ulong)local_274);
          *puVar7 = uVar4;
          initTables(in_stack_fffffffffffff7f0);
          local_364 = 0;
          for (local_368 = 0; uVar4 = local_368,
              uVar3 = Kernel::Signature::functions((Signature *)0x2d89f1), uVar4 < uVar3;
              local_368 = local_368 + 1) {
            local_370 = Kernel::Signature::getFunction
                                  (in_stack_fffffffffffff730,in_stack_fffffffffffff72c);
            local_378 = Kernel::Signature::Symbol::fnType
                                  ((Symbol *)
                                   CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740));
            local_37c = Kernel::Signature::Symbol::arity(local_370);
            Lib::DArray<unsigned_int>::DArray
                      ((DArray<unsigned_int> *)
                       CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                       (size_t)in_stack_fffffffffffff738);
            Lib::DArray<unsigned_int>::DArray
                      ((DArray<unsigned_int> *)
                       CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                       (size_t)in_stack_fffffffffffff738);
            for (local_3b4 = 0; local_3b4 < local_37c; local_3b4 = local_3b4 + 1) {
              puVar7 = Lib::DArray<unsigned_int>::operator[](&local_398,(ulong)local_3b4);
              *puVar7 = 1;
            }
            do {
              for (local_3b8 = 0; local_3b8 < local_37c; local_3b8 = local_3b8 + 1) {
                local_3c8 = (uint64_t)
                            Kernel::OperatorType::arg
                                      ((OperatorType *)in_stack_fffffffffffff738,
                                       (uint)((ulong)in_stack_fffffffffffff730 >> 0x20));
                pTVar8 = Kernel::TermList::term((TermList *)0x2d8c34);
                local_3bc = Kernel::Term::functor(pTVar8);
                if (local_3bc == local_274) {
                  Lib::DArray<unsigned_int>::operator[](&local_398,(ulong)local_3b8);
                  puVar7 = Lib::
                           DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::
                           get((DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>
                                *)in_stack_fffffffffffff730,in_stack_fffffffffffff72c);
                  local_734 = *puVar7;
                }
                else {
                  puVar7 = Lib::DArray<unsigned_int>::operator[](&local_398,(ulong)local_3b8);
                  local_734 = *puVar7;
                }
                puVar7 = Lib::DArray<unsigned_int>::operator[](&local_3b0,(ulong)local_3b8);
                *puVar7 = local_734;
              }
              in_R8 = (void *)(ulong)local_368;
              local_3cc = args2var(in_stack_fffffffffffff770,in_stack_fffffffffffff768,
                                   (DArray<unsigned_int> *)in_stack_fffffffffffff760._content,
                                   in_stack_fffffffffffff758,in_stack_fffffffffffff754,
                                   (OperatorType *)in_stack_fffffffffffff748);
              puVar7 = Lib::DArray<unsigned_int>::operator[](local_318,(ulong)local_3cc);
              local_3d0 = *puVar7;
              if (local_3d0 != 0) {
                local_3e0 = (uint64_t)
                            Kernel::OperatorType::result((OperatorType *)in_stack_fffffffffffff738);
                pTVar8 = Kernel::TermList::term((TermList *)0x2d8e0b);
                local_3d4 = Kernel::Term::functor(pTVar8);
                if (local_3d4 == local_274) {
                  puVar7 = Lib::
                           DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::
                           get((DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>
                                *)in_stack_fffffffffffff730,in_stack_fffffffffffff72c);
                  local_77c = *puVar7;
                }
                else {
                  local_77c = local_3d0;
                }
                local_3e4 = local_77c;
                puVar7 = Lib::DArray<unsigned_int>::operator[](in_RDI + 3,(ulong)local_364);
                *puVar7 = local_77c;
                if ((local_37c == 0) &&
                   (bVar2 = Kernel::Signature::Symbol::introduced(local_370), !bVar2)) {
                  pDVar9 = Lib::DArray<Lib::DArray<int>_>::operator[]
                                     ((DArray<Lib::DArray<int>_> *)(in_RDI + 5),(ulong)local_3d4);
                  piVar10 = Lib::DArray<int>::operator[](pDVar9,(ulong)local_3e4);
                  uVar4 = local_368;
                  if (*piVar10 == -1) {
                    pDVar9 = Lib::DArray<Lib::DArray<int>_>::operator[]
                                       ((DArray<Lib::DArray<int>_> *)(in_RDI + 5),(ulong)local_3d4);
                    puVar7 = (uint *)Lib::DArray<int>::operator[](pDVar9,(ulong)local_3e4);
                    *puVar7 = uVar4;
                  }
                }
              }
              local_364 = local_364 + 1;
              for (local_3e8 = 0; local_3e8 < local_37c; local_3e8 = local_3e8 + 1) {
                puVar7 = Lib::DArray<unsigned_int>::operator[](&local_398,(ulong)local_3e8);
                *puVar7 = *puVar7 + 1;
                puVar7 = Lib::DArray<unsigned_int>::operator[](&local_398,(ulong)local_3e8);
                uVar4 = *puVar7;
                local_3f0 = (uint64_t)
                            Kernel::OperatorType::arg
                                      ((OperatorType *)in_stack_fffffffffffff738,
                                       (uint)((ulong)in_stack_fffffffffffff730 >> 0x20));
                pTVar8 = Kernel::TermList::term((TermList *)0x2d909e);
                uVar3 = Kernel::Term::functor(pTVar8);
                puVar7 = Lib::DArray<unsigned_int>::operator[](in_RDI,(ulong)uVar3);
                if (uVar4 <= *puVar7) break;
                puVar7 = Lib::DArray<unsigned_int>::operator[](&local_398,(ulong)local_3e8);
                *puVar7 = 1;
              }
            } while (local_3e8 != local_37c);
            Lib::DArray<unsigned_int>::~DArray((DArray<unsigned_int> *)in_stack_fffffffffffff730);
            Lib::DArray<unsigned_int>::~DArray((DArray<unsigned_int> *)in_stack_fffffffffffff730);
          }
          local_364 = 0;
          for (local_3f4 = 1; uVar4 = local_3f4,
              uVar3 = Kernel::Signature::predicates((Signature *)0x2d91c6), uVar4 < uVar3;
              local_3f4 = local_3f4 + 1) {
            in_stack_fffffffffffff7f0 =
                 (FiniteModelMultiSorted *)
                 Kernel::Signature::getPredicate
                           (in_stack_fffffffffffff730,in_stack_fffffffffffff72c);
            local_400 = in_stack_fffffffffffff7f0;
            local_408 = Kernel::Signature::Symbol::predType
                                  ((Symbol *)
                                   CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740));
            local_40c = Kernel::Signature::Symbol::arity((Symbol *)local_400);
            Lib::DArray<unsigned_int>::DArray
                      ((DArray<unsigned_int> *)
                       CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                       (size_t)in_stack_fffffffffffff738);
            Lib::DArray<unsigned_int>::DArray
                      ((DArray<unsigned_int> *)
                       CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                       (size_t)in_stack_fffffffffffff738);
            for (local_444 = 0; local_444 < local_40c; local_444 = local_444 + 1) {
              puVar7 = Lib::DArray<unsigned_int>::operator[](&local_428,(ulong)local_444);
              *puVar7 = 1;
            }
            do {
              for (local_448 = 0; local_448 < local_40c; local_448 = local_448 + 1) {
                Kernel::OperatorType::arg
                          ((OperatorType *)in_stack_fffffffffffff738,
                           (uint)((ulong)in_stack_fffffffffffff730 >> 0x20));
                pTVar8 = Kernel::TermList::term((TermList *)0x2d938c);
                uVar4 = Kernel::Term::functor(pTVar8);
                if (uVar4 == local_274) {
                  Lib::DArray<unsigned_int>::operator[](&local_428,(ulong)local_448);
                  puVar7 = Lib::
                           DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::
                           get((DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>
                                *)in_stack_fffffffffffff730,in_stack_fffffffffffff72c);
                  local_854 = *puVar7;
                }
                else {
                  puVar7 = Lib::DArray<unsigned_int>::operator[](&local_428,(ulong)local_448);
                  local_854 = *puVar7;
                }
                puVar7 = Lib::DArray<unsigned_int>::operator[](&local_440,(ulong)local_448);
                *puVar7 = local_854;
              }
              in_R8 = (void *)(ulong)local_3f4;
              uVar4 = args2var(in_stack_fffffffffffff770,in_stack_fffffffffffff768,
                               (DArray<unsigned_int> *)in_stack_fffffffffffff760._content,
                               in_stack_fffffffffffff758,in_stack_fffffffffffff754,
                               (OperatorType *)in_stack_fffffffffffff748);
              pcVar11 = Lib::DArray<char>::operator[](local_348,(ulong)uVar4);
              cVar1 = *pcVar11;
              uVar5 = (ulong)local_364;
              local_364 = local_364 + 1;
              pcVar11 = Lib::DArray<char>::operator[]((DArray<char> *)(in_RDI + 4),uVar5);
              *pcVar11 = cVar1;
              for (local_464 = 0; local_464 < local_40c; local_464 = local_464 + 1) {
                in_stack_fffffffffffff770 =
                     (FiniteModelMultiSorted *)
                     Lib::DArray<unsigned_int>::operator[](&local_428,(ulong)local_464);
                *(uint *)&(in_stack_fffffffffffff770->_sizes)._size =
                     (uint)(in_stack_fffffffffffff770->_sizes)._size + 1;
                in_stack_fffffffffffff768 =
                     (DArray<unsigned_int> *)
                     Lib::DArray<unsigned_int>::operator[](&local_428,(ulong)local_464);
                in_stack_fffffffffffff754 = (uint)in_stack_fffffffffffff768->_size;
                in_stack_fffffffffffff758 = in_RDI;
                in_stack_fffffffffffff760 =
                     Kernel::OperatorType::arg
                               ((OperatorType *)in_stack_fffffffffffff738,
                                (uint)((ulong)in_stack_fffffffffffff730 >> 0x20));
                in_stack_fffffffffffff748 = Kernel::TermList::term((TermList *)0x2d95f7);
                in_stack_fffffffffffff744 = Kernel::Term::functor(in_stack_fffffffffffff748);
                in_stack_fffffffffffff738 =
                     (DArray<unsigned_int> *)
                     Lib::DArray<unsigned_int>::operator[]
                               (in_stack_fffffffffffff758,(ulong)in_stack_fffffffffffff744);
                if (in_stack_fffffffffffff754 <= *(uint *)&in_stack_fffffffffffff738->_size) break;
                in_stack_fffffffffffff730 =
                     (Signature *)Lib::DArray<unsigned_int>::operator[](&local_428,(ulong)local_464)
                ;
                *(uint *)&(in_stack_fffffffffffff730->_dividesNvalues)._capacity = 1;
              }
            } while (local_464 != local_40c);
            Lib::DArray<unsigned_int>::~DArray((DArray<unsigned_int> *)in_stack_fffffffffffff730);
            Lib::DArray<unsigned_int>::~DArray((DArray<unsigned_int> *)in_stack_fffffffffffff730);
          }
          Lib::DArray<unsigned_int>::~DArray((DArray<unsigned_int> *)in_stack_fffffffffffff730);
          Lib::DArray<char>::~DArray((DArray<char> *)in_stack_fffffffffffff730);
          Lib::DArray<unsigned_int>::~DArray((DArray<unsigned_int> *)in_stack_fffffffffffff730);
          Lib::DArray<unsigned_int>::~DArray((DArray<unsigned_int> *)in_stack_fffffffffffff730);
          Lib::DArray<unsigned_int>::~DArray((DArray<unsigned_int> *)in_stack_fffffffffffff730);
          local_2e8 = 0;
        }
        Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
                  ((DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                   in_stack_fffffffffffff730);
        Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
                  ((DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                   in_stack_fffffffffffff730);
        local_264 = local_264 + 1;
      } while( true );
    }
    puVar7 = Lib::Stack<unsigned_int>::operator[](local_10,(ulong)local_1c);
    local_20 = *puVar7;
    local_28 = Kernel::Signature::getFunction(in_stack_fffffffffffff730,in_stack_fffffffffffff72c);
    Kernel::Signature::Symbol::fnType
              ((Symbol *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740));
    local_38 = (uint64_t)Kernel::OperatorType::result((OperatorType *)in_stack_fffffffffffff738);
    pTVar8 = Kernel::TermList::term((TermList *)0x2d7522);
    local_2c = Kernel::Term::functor(pTVar8);
    Lib::DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::DHSet
              ((DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x2d753e);
    Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::DHMap(local_88);
    Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::DHMap(&local_c0);
    puVar7 = Lib::DArray<unsigned_int>::operator[](in_RDI,(ulong)local_2c);
    local_c4 = *puVar7;
    local_c8 = 0;
    puVar7 = Lib::DArray<unsigned_int>::operator[](in_RDI + 1,(ulong)local_20);
    local_cc = *puVar7;
    for (local_d0 = 1; iVar12 = (int)sVar6, local_d0 <= local_c4; local_d0 = local_d0 + 1) {
      uVar5 = (ulong)local_cc;
      local_cc = local_cc + 1;
      puVar7 = Lib::DArray<unsigned_int>::operator[](in_RDI + 3,uVar5);
      local_d4 = *puVar7;
      bVar2 = Lib::DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                        ((DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                         in_stack_fffffffffffff730,in_stack_fffffffffffff72c);
      if (bVar2) {
        local_c8 = local_c8 + 1;
        Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                  ((DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                   CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                   (uint)((ulong)in_stack_fffffffffffff738 >> 0x20),(uint)in_stack_fffffffffffff738)
        ;
        Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                  ((DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                   CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                   (uint)((ulong)in_stack_fffffffffffff738 >> 0x20),(uint)in_stack_fffffffffffff738)
        ;
      }
    }
    Lib::DArray<unsigned_int>::DArray
              ((DArray<unsigned_int> *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740)
               ,in_stack_fffffffffffff738);
    Lib::DArray<unsigned_int>::DArray
              ((DArray<unsigned_int> *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740)
               ,in_stack_fffffffffffff738);
    Lib::DArray<unsigned_int>::DArray
              ((DArray<unsigned_int> *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740)
               ,in_stack_fffffffffffff738);
    Lib::DArray<char>::DArray
              ((DArray<char> *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
               (DArray<char> *)in_stack_fffffffffffff738);
    Lib::DArray<unsigned_int>::clone(&local_150,(__fn *)in_RDI,__child_stack,iVar12,in_R8);
    uVar4 = local_c8;
    puVar7 = Lib::DArray<unsigned_int>::operator[](in_RDI,(ulong)local_2c);
    *puVar7 = uVar4;
    initTables(in_stack_fffffffffffff7f0);
    local_154 = 0;
    for (local_158 = 0; uVar4 = local_158,
        uVar3 = Kernel::Signature::functions((Signature *)0x2d780d), uVar4 < uVar3;
        local_158 = local_158 + 1) {
      local_160 = Kernel::Signature::getFunction
                            (in_stack_fffffffffffff730,in_stack_fffffffffffff72c);
      local_168 = Kernel::Signature::Symbol::fnType
                            ((Symbol *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740)
                            );
      local_16c = Kernel::Signature::Symbol::arity(local_160);
      Lib::DArray<unsigned_int>::DArray
                ((DArray<unsigned_int> *)
                 CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                 (size_t)in_stack_fffffffffffff738);
      Lib::DArray<unsigned_int>::DArray
                ((DArray<unsigned_int> *)
                 CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                 (size_t)in_stack_fffffffffffff738);
      for (local_1a4 = 0; local_1a4 < local_16c; local_1a4 = local_1a4 + 1) {
        puVar7 = Lib::DArray<unsigned_int>::operator[](&local_188,(ulong)local_1a4);
        *puVar7 = 1;
      }
      do {
        for (local_1a8 = 0; local_1a8 < local_16c; local_1a8 = local_1a8 + 1) {
          local_1b8 = (uint64_t)
                      Kernel::OperatorType::arg
                                ((OperatorType *)in_stack_fffffffffffff738,
                                 (uint)((ulong)in_stack_fffffffffffff730 >> 0x20));
          pTVar8 = Kernel::TermList::term((TermList *)0x2d7a50);
          local_1ac = Kernel::Term::functor(pTVar8);
          if (local_1ac == local_2c) {
            Lib::DArray<unsigned_int>::operator[](&local_188,(ulong)local_1a8);
            puVar7 = Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::
                     get((DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                         in_stack_fffffffffffff730,in_stack_fffffffffffff72c);
            local_504 = *puVar7;
          }
          else {
            puVar7 = Lib::DArray<unsigned_int>::operator[](&local_188,(ulong)local_1a8);
            local_504 = *puVar7;
          }
          puVar7 = Lib::DArray<unsigned_int>::operator[](&local_1a0,(ulong)local_1a8);
          *puVar7 = local_504;
        }
        in_R8 = (void *)(ulong)local_158;
        local_1bc = args2var(in_stack_fffffffffffff770,in_stack_fffffffffffff768,
                             (DArray<unsigned_int> *)in_stack_fffffffffffff760._content,
                             in_stack_fffffffffffff758,in_stack_fffffffffffff754,
                             (OperatorType *)in_stack_fffffffffffff748);
        puVar7 = Lib::DArray<unsigned_int>::operator[](&local_108,(ulong)local_1bc);
        local_1c0 = *puVar7;
        if (local_1c0 != 0) {
          local_1d0 = (uint64_t)
                      Kernel::OperatorType::result((OperatorType *)in_stack_fffffffffffff738);
          pTVar8 = Kernel::TermList::term((TermList *)0x2d7c27);
          local_1c4 = Kernel::Term::functor(pTVar8);
          if (local_1c4 == local_2c) {
            puVar7 = Lib::DArray<unsigned_int>::operator[](&local_f0,(ulong)local_20);
            Lib::DArray<unsigned_int>::operator[](&local_108,(ulong)((*puVar7 - 1) + local_1c0));
            puVar7 = Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::
                     get((DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                         in_stack_fffffffffffff730,in_stack_fffffffffffff72c);
            local_55c = *puVar7;
          }
          else {
            local_55c = local_1c0;
          }
          local_1d4 = local_55c;
          puVar7 = Lib::DArray<unsigned_int>::operator[](in_RDI + 3,(ulong)local_154);
          *puVar7 = local_55c;
          if ((local_16c == 0) && (bVar2 = Kernel::Signature::Symbol::introduced(local_160), !bVar2)
             ) {
            pDVar9 = Lib::DArray<Lib::DArray<int>_>::operator[]
                               ((DArray<Lib::DArray<int>_> *)(in_RDI + 5),(ulong)local_1c4);
            piVar10 = Lib::DArray<int>::operator[](pDVar9,(ulong)local_1d4);
            uVar4 = local_158;
            if (*piVar10 == -1) {
              pDVar9 = Lib::DArray<Lib::DArray<int>_>::operator[]
                                 ((DArray<Lib::DArray<int>_> *)(in_RDI + 5),(ulong)local_1c4);
              puVar7 = (uint *)Lib::DArray<int>::operator[](pDVar9,(ulong)local_1d4);
              *puVar7 = uVar4;
            }
          }
        }
        local_154 = local_154 + 1;
        for (local_1d8 = 0; local_1d8 < local_16c; local_1d8 = local_1d8 + 1) {
          puVar7 = Lib::DArray<unsigned_int>::operator[](&local_188,(ulong)local_1d8);
          *puVar7 = *puVar7 + 1;
          puVar7 = Lib::DArray<unsigned_int>::operator[](&local_188,(ulong)local_1d8);
          uVar4 = *puVar7;
          local_1e0 = (uint64_t)
                      Kernel::OperatorType::arg
                                ((OperatorType *)in_stack_fffffffffffff738,
                                 (uint)((ulong)in_stack_fffffffffffff730 >> 0x20));
          pTVar8 = Kernel::TermList::term((TermList *)0x2d7f13);
          uVar3 = Kernel::Term::functor(pTVar8);
          puVar7 = Lib::DArray<unsigned_int>::operator[](in_RDI,(ulong)uVar3);
          if (uVar4 <= *puVar7) break;
          puVar7 = Lib::DArray<unsigned_int>::operator[](&local_188,(ulong)local_1d8);
          *puVar7 = 1;
        }
      } while (local_1d8 != local_16c);
      Lib::DArray<unsigned_int>::~DArray((DArray<unsigned_int> *)in_stack_fffffffffffff730);
      Lib::DArray<unsigned_int>::~DArray((DArray<unsigned_int> *)in_stack_fffffffffffff730);
    }
    local_154 = 0;
    for (local_1e4 = 1; uVar4 = local_1e4,
        uVar3 = Kernel::Signature::predicates((Signature *)0x2d803b), uVar4 < uVar3;
        local_1e4 = local_1e4 + 1) {
      local_1f0 = Kernel::Signature::getPredicate
                            (in_stack_fffffffffffff730,in_stack_fffffffffffff72c);
      local_1f8 = Kernel::Signature::Symbol::predType
                            ((Symbol *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740)
                            );
      local_1fc = Kernel::Signature::Symbol::arity(local_1f0);
      Lib::DArray<unsigned_int>::DArray
                ((DArray<unsigned_int> *)
                 CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                 (size_t)in_stack_fffffffffffff738);
      Lib::DArray<unsigned_int>::DArray
                ((DArray<unsigned_int> *)
                 CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                 (size_t)in_stack_fffffffffffff738);
      for (local_234 = 0; local_234 < local_1fc; local_234 = local_234 + 1) {
        puVar7 = Lib::DArray<unsigned_int>::operator[](&local_218,(ulong)local_234);
        *puVar7 = 1;
      }
      do {
        for (local_238 = 0; local_238 < local_1fc; local_238 = local_238 + 1) {
          local_248 = (uint64_t)
                      Kernel::OperatorType::arg
                                ((OperatorType *)in_stack_fffffffffffff738,
                                 (uint)((ulong)in_stack_fffffffffffff730 >> 0x20));
          pTVar8 = Kernel::TermList::term((TermList *)0x2d8201);
          local_23c = Kernel::Term::functor(pTVar8);
          if (local_23c == local_2c) {
            Lib::DArray<unsigned_int>::operator[](&local_218,(ulong)local_238);
            puVar7 = Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::
                     get((DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                         in_stack_fffffffffffff730,in_stack_fffffffffffff72c);
            local_634 = *puVar7;
          }
          else {
            puVar7 = Lib::DArray<unsigned_int>::operator[](&local_218,(ulong)local_238);
            local_634 = *puVar7;
          }
          puVar7 = Lib::DArray<unsigned_int>::operator[](&local_230,(ulong)local_238);
          *puVar7 = local_634;
        }
        in_R8 = (void *)(ulong)local_1e4;
        local_24c = args2var(in_stack_fffffffffffff770,in_stack_fffffffffffff768,
                             (DArray<unsigned_int> *)in_stack_fffffffffffff760._content,
                             in_stack_fffffffffffff758,in_stack_fffffffffffff754,
                             (OperatorType *)in_stack_fffffffffffff748);
        pcVar11 = Lib::DArray<char>::operator[](local_138,(ulong)local_24c);
        cVar1 = *pcVar11;
        uVar5 = (ulong)local_154;
        local_154 = local_154 + 1;
        local_24d = cVar1;
        pcVar11 = Lib::DArray<char>::operator[]((DArray<char> *)(in_RDI + 4),uVar5);
        *pcVar11 = cVar1;
        for (local_254 = 0; local_254 < local_1fc; local_254 = local_254 + 1) {
          puVar7 = Lib::DArray<unsigned_int>::operator[](&local_218,(ulong)local_254);
          *puVar7 = *puVar7 + 1;
          puVar7 = Lib::DArray<unsigned_int>::operator[](&local_218,(ulong)local_254);
          uVar4 = *puVar7;
          local_260 = (uint64_t)
                      Kernel::OperatorType::arg
                                ((OperatorType *)in_stack_fffffffffffff738,
                                 (uint)((ulong)in_stack_fffffffffffff730 >> 0x20));
          pTVar8 = Kernel::TermList::term((TermList *)0x2d84ad);
          uVar3 = Kernel::Term::functor(pTVar8);
          puVar7 = Lib::DArray<unsigned_int>::operator[](in_RDI,(ulong)uVar3);
          if (uVar4 <= *puVar7) break;
          puVar7 = Lib::DArray<unsigned_int>::operator[](&local_218,(ulong)local_254);
          *puVar7 = 1;
        }
      } while (local_254 != local_1fc);
      Lib::DArray<unsigned_int>::~DArray((DArray<unsigned_int> *)in_stack_fffffffffffff730);
      Lib::DArray<unsigned_int>::~DArray((DArray<unsigned_int> *)in_stack_fffffffffffff730);
    }
    Lib::DArray<unsigned_int>::~DArray((DArray<unsigned_int> *)in_stack_fffffffffffff730);
    Lib::DArray<char>::~DArray((DArray<char> *)in_stack_fffffffffffff730);
    Lib::DArray<unsigned_int>::~DArray((DArray<unsigned_int> *)in_stack_fffffffffffff730);
    Lib::DArray<unsigned_int>::~DArray((DArray<unsigned_int> *)in_stack_fffffffffffff730);
    Lib::DArray<unsigned_int>::~DArray((DArray<unsigned_int> *)in_stack_fffffffffffff730);
    Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
              ((DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)
               in_stack_fffffffffffff730);
    Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
              ((DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)
               in_stack_fffffffffffff730);
    Lib::DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHSet
              ((DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x2d8606);
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

void FiniteModelMultiSorted::eliminateSortFunctionsAndPredicates(const Stack<unsigned> &sortFunctions, const Stack<unsigned> &sortPredicates)
{
  // if we already started evaluating things with the model, elimination would be more complicated
  ASS_EQ(_domainConstants.size(),0);
  ASS_EQ(_domainConstantsRev.size(),0);

  // let's do functions first
  for(unsigned i = 0; i<sortFunctions.size(); i++) {
    unsigned elim_f = sortFunctions[i];
    Signature::Symbol* elim_symb = env.signature->getFunction(elim_f);
    ASS_EQ(elim_symb->arity(),1)
    unsigned srt = elim_symb->fnType()->result().term()->functor();

    DHSet<unsigned> f_range;
    DHMap<unsigned,unsigned> new_to_old;
    DHMap<unsigned,unsigned> old_to_new;

    unsigned origSize = _sizes[srt];
    unsigned newSize = 0;

    // srt's domain is getting reduced to the range of f
    {
      unsigned var = _f_offsets[elim_f];
      for(unsigned j = 1; j<=origSize; j++) {
        unsigned res = _f_interpretation[var++];
        //cout << "f(" << j << ")=" << res << endl;
        if (f_range.insert(res)) {
          newSize++;
          new_to_old.insert(newSize,res);
          old_to_new.insert(res,newSize);
        }
      }
    }

    // we will need to reencode everything

    // save the old stuff
    auto old_f_offsets        = std::move(_f_offsets);
    auto old_f_interpretation = std::move(_f_interpretation);
    auto old_p_offsets        = std::move(_p_offsets);
    auto old_p_interpretation = std::move(_p_interpretation);
    auto old_sizes = _sizes.clone();

    // update size of the affected sort
    _sizes[srt] = newSize;
    // cout << "newSize " << newSize << endl;
    initTables();

    // every function and predicate need to get reencoded
    // - arguments of sort srt now iterate over a different (likely smaller domain)
    // - function values of sort srt still need to passed through the ``disappearing'' elim_f

    unsigned var = 0; // ... var will fly linearly through all this
    for(unsigned f=0; f<env.signature->functions();f++){
      ASS_EQ(var,_f_offsets[f]);
      Signature::Symbol* symb = env.signature->getFunction(f);
      OperatorType* sig = symb->fnType();
      unsigned arity = symb->arity();

      // cout << "f = " << f << " arity= " << arity << endl;

      DArray<unsigned> args(arity); // ... args will respect the table encoding
      DArray<unsigned> old_args(arity);
      for(unsigned i=0;i<arity;i++){ args[i]=1; }

      for(;;) {
        // encode args into old_args
        for(unsigned i=0;i<arity;i++){
          unsigned i_srt = sig->arg(i).term()->functor();
          old_args[i] = (i_srt == srt) ? new_to_old.get(args[i]) : args[i];
        }

        // reencode and store
        unsigned old_var = args2var(old_args,old_sizes,old_f_offsets,f,sig);
        unsigned old_res = old_f_interpretation[old_var];

        if (old_res) { // eliminated symbols don't have reasonable values
          unsigned res_srt = sig->result().term()->functor();
          unsigned res = (res_srt == srt) ?
                            // need to first pass old_res through elim_f, before mapping to the new domain
                            old_to_new.get(old_f_interpretation[old_f_offsets[elim_f]+old_res-1]) :
                            old_res;

          _f_interpretation[var] = res;

          if (arity==0 && !symb->introduced() && sortRepr[res_srt][res] == -1){
            sortRepr[res_srt][res]=f;
          }
        }

        // move var
        var++;
        // increase args
        unsigned i;
        for(i=0;i<arity;i++) {
          args[i]++;
          if(args[i] <= _sizes[sig->arg(i).term()->functor()]){
            break;
          }
          args[i]=1;
        }
        if (i == arity) {
          break;
        }
      }
    }

    var = 0; // ... var will fly linearly through all this again (for the predicates)
    for(unsigned p=1; p<env.signature->predicates();p++){
      ASS_EQ(var,_p_offsets[p]);
      Signature::Symbol* symb = env.signature->getPredicate(p);
      OperatorType* sig = symb->predType();
      unsigned arity = symb->arity();

      // cout << "p = " << p << " arity= " << arity << endl;

      DArray<unsigned> args(arity); // ... args will respect the table encoding
      DArray<unsigned> old_args(arity);
      for(unsigned i=0;i<arity;i++){ args[i]=1; }

      for(;;) {
        // encode args into old_args
        for(unsigned i=0;i<arity;i++){
          unsigned i_srt = sig->arg(i).term()->functor();
          old_args[i] = (i_srt == srt) ? new_to_old.get(args[i]) : args[i];
        }

        // reencode and store
        unsigned old_var = args2var(old_args,old_sizes,old_p_offsets,p,sig);
        char old_res = old_p_interpretation[old_var];

        _p_interpretation[var++] = old_res; // no change for predicates

        // increase args
        unsigned i;
        for(i=0;i<arity;i++) {
          args[i]++;
          if(args[i] <= _sizes[sig->arg(i).term()->functor()]){
            break;
          }
          args[i]=1;
        }
        if (i == arity) {
          break;
        }
      }
    }
  }

  // let's do predicates now
  for(unsigned i = 0; i<sortPredicates.size(); i++) {
    unsigned elim_p = sortPredicates[i];
    Signature::Symbol* elim_symb = env.signature->getPredicate(elim_p);
    ASS_EQ(elim_symb->arity(),1)
    unsigned srt = elim_symb->predType()->arg(0).term()->functor();

    // cout << "Eliminate p = " << elim_p << endl;

    DHMap<unsigned,unsigned> new_to_old;
    DHMap<unsigned,unsigned> old_to_new;

    unsigned origSize = _sizes[srt];
    unsigned newSize = 0;

    // srt's domain is getting reduced to those elements for which p is true
    {
      unsigned var = _p_offsets[elim_p];
      for(unsigned j = 1; j<=origSize; j++) {
        char res = _p_interpretation[var++];
        // cout << "p(" << j << ")=" << (unsigned)res << endl;
        if (res == INTP_TRUE) {
          newSize++;
          new_to_old.insert(newSize,j);
          old_to_new.insert(j,newSize);
        }
      }
    }

    if (origSize == newSize)
      continue;

    // we will need to reencode everything

    // save the old stuff
    auto old_f_offsets        = std::move(_f_offsets);
    auto old_f_interpretation = std::move(_f_interpretation);
    auto old_p_offsets        = std::move(_p_offsets);
    auto old_p_interpretation = std::move(_p_interpretation);
    auto old_sizes = _sizes.clone();

    // update size of the affected sort
    _sizes[srt] = newSize;
    // cout << "origSize = " << origSize << " --> newSize = " << newSize << endl;

    initTables();

    // every function and predicate need to get reencoded
    // - arguments of sort srt now iterate over a different (likely smaller domain)

    unsigned var = 0; // ... var will fly linearly through all this
    for(unsigned f=0; f<env.signature->functions();f++){
      ASS_EQ(var,_f_offsets[f]);
      Signature::Symbol* symb = env.signature->getFunction(f);
      OperatorType* sig = symb->fnType();
      unsigned arity = symb->arity();

      // cout << "  f = " << f << " arity= " << arity << " of name " << symb->name() << endl;
      // cout << "->usageCnt() == " << symb->usageCnt() << endl;

      DArray<unsigned> args(arity); // ... args will respect the table encoding
      DArray<unsigned> old_args(arity);
      for(unsigned i=0;i<arity;i++){ args[i]=1; }

      for(;;) {
        // encode args into old_args
        for(unsigned i=0;i<arity;i++){
          unsigned i_srt = sig->arg(i).term()->functor();
          old_args[i] = (i_srt == srt) ? new_to_old.get(args[i]) : args[i];
        }

        // reencode and store
        unsigned old_var = args2var(old_args,old_sizes,old_f_offsets,f,sig);
        unsigned old_res = old_f_interpretation[old_var];

        if (old_res) { // eliminated symbols don't have reasonable values
          unsigned res_srt = sig->result().term()->functor();
          // this should be stipulated by the extra sort-predicate axioms
          ASS(res_srt != srt || old_p_interpretation[old_p_offsets[elim_p]+old_res-1] == INTP_TRUE)

          unsigned res = (res_srt == srt) ? old_to_new.get(old_res) : old_res;
          _f_interpretation[var] = res;

          if (arity==0 && !symb->introduced() && sortRepr[res_srt][res] == -1) {
            sortRepr[res_srt][res]=f;
          }
        }

        // move var
        var++;
        // increase args
        unsigned i;
        for(i=0;i<arity;i++) {
          args[i]++;
          if(args[i] <= _sizes[sig->arg(i).term()->functor()]){
            break;
          }
          args[i]=1;
        }
        if (i == arity) {
          break;
        }
      }
    }

    var = 0; // ... var will fly linearly through all this again (for the predicates)
    for(unsigned p=1; p<env.signature->predicates();p++){
      ASS_EQ(var,_p_offsets[p]);
      Signature::Symbol* symb = env.signature->getPredicate(p);
      OperatorType* sig = symb->predType();
      unsigned arity = symb->arity();

      // cout << "p = " << p << " arity= " << arity << endl;

      DArray<unsigned> args(arity); // ... args will respect the table encoding
      DArray<unsigned> old_args(arity);
      for(unsigned i=0;i<arity;i++){ args[i]=1; }

      for(;;) {
        // encode args into old_args
        for(unsigned i=0;i<arity;i++){
          unsigned i_srt = sig->arg(i).term()->functor();
          old_args[i] = (i_srt == srt) ? new_to_old.get(args[i]) : args[i];
        }

        // reencode and store
        unsigned old_var = args2var(old_args,old_sizes,old_p_offsets,p,sig);
        unsigned old_res = old_p_interpretation[old_var];

        _p_interpretation[var++] = old_res; // no change for predicates

        // increase args
        unsigned i;
        for(i=0;i<arity;i++) {
          args[i]++;
          if(args[i] <= _sizes[sig->arg(i).term()->functor()]){
            break;
          }
          args[i]=1;
        }
        if (i == arity) {
          break;
        }
      }
    }
  }
}